

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_log__do_write_end
              (st_ptls_log_point_t *point,st_ptls_log_conn_state_t *conn,
              _func_char_ptr_void_ptr *get_sni,void *get_sni_arg,int includes_appdata)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  long *in_FS_OFFSET;
  bool bVar4;
  ssize_t wret;
  size_t slot;
  int local_38;
  uint32_t active;
  int needs_appdata;
  int includes_appdata_local;
  void *get_sni_arg_local;
  _func_char_ptr_void_ptr *get_sni_local;
  st_ptls_log_conn_state_t *conn_local;
  st_ptls_log_point_t *point_local;
  
  iVar1 = expand_logbuf_or_invalidate("}\n",2,0);
  if (iVar1 == 0) {
    point_local._4_4_ = 0;
  }
  else {
    local_38 = 0;
    pthread_mutex_lock((pthread_mutex_t *)&logctx.mutex);
    if ((point->state).generation != ptls_log._generation) {
      ptls_log__recalc_point(1,point);
    }
    slot._4_4_ = (point->state).active_conns;
    if ((conn != (st_ptls_log_conn_state_t *)0x0) &&
       ((conn->state).generation != ptls_log._generation)) {
      ptls_log__recalc_conn(1,conn,get_sni,get_sni_arg);
      slot._4_4_ = (conn->state).active_conns & slot._4_4_;
    }
    wret = 0;
    for (; slot._4_4_ != 0; slot._4_4_ = slot._4_4_ >> 1) {
      if ((slot._4_4_ & 1) != 0) {
        if (logctx.conns[wret].points == (char *)0x0) {
          __assert_fail("logctx.conns[slot].points != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                        ,0x1bc6,
                        "int ptls_log__do_write_end(struct st_ptls_log_point_t *, struct st_ptls_log_conn_state_t *, const char *(*)(void *), void *, int)"
                       );
        }
        if ((uint)(logctx.conns[wret].field_0x24 & 1) == includes_appdata) {
          do {
            sVar2 = write(logctx.conns[wret].fd,*(void **)(*in_FS_OFFSET + -200),
                          *(size_t *)(*in_FS_OFFSET + -0xb8));
            bVar4 = false;
            if (sVar2 == -1) {
              piVar3 = __errno_location();
              bVar4 = *piVar3 == 4;
            }
          } while (bVar4);
          if (sVar2 != *(long *)(*in_FS_OFFSET + -0xb8)) {
            if ((sVar2 < 1) &&
               ((sVar2 != -1 ||
                ((piVar3 = __errno_location(), *piVar3 != 0xb &&
                 (piVar3 = __errno_location(), *piVar3 != 0xb)))))) {
              close_log_fd(wret);
            }
            else {
              logctx.num_lost = logctx.num_lost + 1;
            }
          }
        }
        else if ((includes_appdata == 0) && ((ptls_log._0_1_ & 1) != 0)) {
          local_38 = 1;
        }
      }
      wret = wret + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&logctx.mutex);
    if ((includes_appdata != 0) && (local_38 != 0)) {
      __assert_fail("!needs_appdata",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                    ,0x1be0,
                    "int ptls_log__do_write_end(struct st_ptls_log_point_t *, struct st_ptls_log_conn_state_t *, const char *(*)(void *), void *, int)"
                   );
    }
    ptls_buffer_dispose((ptls_buffer_t *)(*in_FS_OFFSET + -200));
    if (*(long *)(*in_FS_OFFSET + -200) != 0) {
      __assert_fail("logbuf.buf.base == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                    ,0x1be3,
                    "int ptls_log__do_write_end(struct st_ptls_log_point_t *, struct st_ptls_log_conn_state_t *, const char *(*)(void *), void *, int)"
                   );
    }
    point_local._4_4_ = local_38;
  }
  return point_local._4_4_;
}

Assistant:

int ptls_log__do_write_end(struct st_ptls_log_point_t *point, struct st_ptls_log_conn_state_t *conn, const char *(*get_sni)(void *),
                           void *get_sni_arg, int includes_appdata)
{
    if (!expand_logbuf_or_invalidate("}\n", 2, 0))
        return 0;

    int needs_appdata = 0;

    pthread_mutex_lock(&logctx.mutex);

    /* calc the active conn bits, updating stale information if necessary */
    if (point->state.generation != ptls_log._generation)
        ptls_log__recalc_point(1, point);
    uint32_t active = point->state.active_conns;
    if (conn != NULL && conn->state.generation != ptls_log._generation) {
        ptls_log__recalc_conn(1, conn, get_sni, get_sni_arg);
        active &= conn->state.active_conns;
    }

    /* iterate through the active connctions */
    for (size_t slot = 0; active != 0; ++slot, active >>= 1) {
        if ((active & 1) == 0)
            continue;

        assert(logctx.conns[slot].points != NULL);

        if (logctx.conns[slot].appdata != includes_appdata) {
            if (!includes_appdata && ptls_log.may_include_appdata)
                needs_appdata = 1;
            continue;
        }

        /* write */
        ssize_t wret;
        while ((wret = write(logctx.conns[slot].fd, logbuf.buf.base, logbuf.buf.off)) == -1 && errno == EINTR)
            ;
        if (wret == logbuf.buf.off) {
            /* success */
        } else if (wret > 0 || (wret == -1 && (errno == EAGAIN || errno == EWOULDBLOCK))) {
            /* partial write or buffer full */
            ++logctx.num_lost;
        } else {
            /* write error; close and unregister the connection */
            close_log_fd(slot);
        }
    }

    pthread_mutex_unlock(&logctx.mutex);

    if (includes_appdata)
        assert(!needs_appdata);

    ptls_buffer_dispose(&logbuf.buf);
    assert(logbuf.buf.base == NULL);
    return needs_appdata;
}